

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  short sVar3;
  stbi__uint32 sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  short sVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined4 uVar36;
  undefined4 z;
  undefined4 z_00;
  undefined4 z_01;
  stbi_uc sVar37;
  byte bVar38;
  stbi_uc sVar39;
  stbi_uc sVar40;
  stbi_uc sVar41;
  byte bVar42;
  stbi__uint32 sVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  stbi__jpeg *psVar48;
  ulong uVar49;
  uchar *data_00;
  float *data_01;
  uchar *puVar50;
  void *pvVar51;
  code *pcVar52;
  stbi__context *psVar53;
  uint uVar54;
  long lVar55;
  short sVar56;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int extraout_EDX_07;
  uint uVar57;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *paVar58;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  ulong extraout_RDX_03;
  long lVar59;
  stbi_uc *extraout_RDX_04;
  stbi_uc *psVar60;
  stbi_uc *extraout_RDX_05;
  stbi_uc *extraout_RDX_06;
  stbi_uc *psVar61;
  byte *pbVar62;
  int iVar63;
  ulong uVar64;
  uint uVar65;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  int iVar66;
  stbi__uint32 sVar67;
  int *piVar68;
  int iVar69;
  ulong uVar70;
  uint uVar71;
  short *psVar72;
  stbi_uc (*pasVar73) [4];
  stbi__context *psVar74;
  bool bVar75;
  undefined1 auVar76 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_8970;
  int local_8950;
  uint local_8938;
  int local_892c;
  uint local_88fc;
  undefined1 local_88f8 [12];
  uint uStack_88ec;
  undefined1 local_88e8 [16];
  undefined8 local_88d0;
  undefined4 local_88c4;
  uint local_88c0;
  int local_88bc;
  undefined8 local_88b8;
  stbi__uint32 local_88b0;
  int local_88ac;
  stbi__gif local_88a8;
  
  psVar60 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar48 = (stbi__jpeg *)malloc(0x4888);
  psVar48->s = s;
  psVar48->idct_block_kernel = stbi__idct_simd;
  psVar48->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar48->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar48->jfif = 0;
  psVar48->app14_color_transform = -1;
  psVar48->marker = 0xff;
  sVar37 = stbi__get_marker(psVar48);
  if (sVar37 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar48);
  if (sVar37 == 0xd8) {
    psVar48 = (stbi__jpeg *)malloc(0x4888);
    psVar48->s = s;
    psVar48->idct_block_kernel = stbi__idct_simd;
    psVar48->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar48->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar48->img_comp[0].raw_data = (void *)0x0;
      psVar48->img_comp[0].raw_coeff = (void *)0x0;
      psVar48->img_comp[1].raw_data = (void *)0x0;
      psVar48->img_comp[1].raw_coeff = (void *)0x0;
      psVar48->img_comp[2].raw_data = (void *)0x0;
      psVar48->img_comp[2].raw_coeff = (void *)0x0;
      psVar48->img_comp[3].raw_data = (void *)0x0;
      psVar48->img_comp[3].raw_coeff = (void *)0x0;
      psVar48->restart_interval = 0;
      iVar44 = stbi__decode_jpeg_header(psVar48,0);
      uVar71 = extraout_EDX;
      if (iVar44 != 0) {
        paVar1 = psVar48->img_comp;
        bVar38 = stbi__get_marker(psVar48);
LAB_00194f5e:
        if (bVar38 == 0xda) {
          psVar53 = psVar48->s;
          sVar37 = stbi__get8(psVar53);
          sVar39 = stbi__get8(psVar53);
          bVar38 = stbi__get8(psVar48->s);
          psVar48->scan_n = (uint)bVar38;
          if ((0xfb < (byte)(bVar38 - 5)) &&
             (psVar53 = psVar48->s, (int)(uint)bVar38 <= psVar53->img_n)) {
            paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)CONCAT11(sVar37,sVar39);
            if ((uint)CONCAT11(sVar37,sVar39) != (uint)bVar38 * 2 + 6) {
              stbi__g_failure_reason = "bad SOS len";
              goto LAB_001963af;
            }
            lVar59 = 0;
            do {
              bVar38 = stbi__get8(psVar53);
              bVar42 = stbi__get8(psVar48->s);
              psVar53 = psVar48->s;
              uVar71 = psVar53->img_n;
              if ((long)(int)uVar71 < 1) {
                uVar70 = 0;
              }
              else {
                uVar70 = 0;
                paVar58 = paVar1;
                while (paVar58->id != (uint)bVar38) {
                  uVar70 = uVar70 + 1;
                  paVar58 = paVar58 + 1;
                  if ((long)(int)uVar71 == uVar70) goto LAB_001963b6;
                }
              }
              if ((uint)uVar70 == uVar71) goto LAB_001963b6;
              uVar49 = uVar70 & 0xffffffff;
              paVar58 = (anon_struct_96_18_0d0905d3 *)(uVar49 * 0x60);
              psVar48->img_comp[uVar49].hd = (uint)(bVar42 >> 4);
              if (0x3f < bVar42) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_001963af;
              }
              paVar58 = paVar1 + uVar49;
              paVar58->ha = bVar42 & 0xf;
              if (3 < (bVar42 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_001963af;
              }
              psVar48->order[lVar59] = (uint)uVar70;
              lVar59 = lVar59 + 1;
            } while (lVar59 < psVar48->scan_n);
            bVar38 = stbi__get8(psVar53);
            psVar48->spec_start = (uint)bVar38;
            bVar38 = stbi__get8(psVar48->s);
            psVar48->spec_end = (uint)bVar38;
            bVar38 = stbi__get8(psVar48->s);
            psVar48->succ_high = (uint)(bVar38 >> 4);
            uVar71 = bVar38 & 0xf;
            paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar71;
            psVar48->succ_low = uVar71;
            iVar44 = psVar48->progressive;
            iVar63 = psVar48->spec_start;
            if (iVar44 == 0) {
              if ((iVar63 != 0) || ((0xf < bVar38 || ((bVar38 & 0xf) != 0)))) {
LAB_001971d1:
                stbi__g_failure_reason = "bad SOS";
                goto LAB_001963af;
              }
              psVar48->spec_end = 0x3f;
            }
            else if ((((0x3f < iVar63) || (0x3f < psVar48->spec_end)) ||
                     (psVar48->spec_end < iVar63)) || ((0xdf < bVar38 || (0xd < uVar71))))
            goto LAB_001971d1;
            uVar71 = psVar48->scan_n;
            uVar70 = (ulong)uVar71;
            iVar63 = psVar48->restart_interval;
            if (iVar63 == 0) {
              iVar63 = 0x7fffffff;
            }
            psVar48->code_buffer = 0;
            psVar48->code_bits = 0;
            psVar48->nomore = 0;
            psVar48->img_comp[3].dc_pred = 0;
            psVar48->img_comp[2].dc_pred = 0;
            psVar48->img_comp[1].dc_pred = 0;
            psVar48->img_comp[0].dc_pred = 0;
            psVar48->marker = 0xff;
            psVar48->todo = iVar63;
            psVar48->eob_run = 0;
            if (iVar44 == 0) {
              if (uVar71 == 1) {
                iVar44 = psVar48->order[0];
                iVar63 = psVar48->img_comp[iVar44].y + 7 >> 3;
                bVar75 = true;
                uVar71 = 1;
                if (0 < iVar63) {
                  uVar54 = paVar1[iVar44].x + 7 >> 3;
                  iVar69 = 0;
                  iVar66 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      lVar59 = 0;
                      do {
                        iVar45 = stbi__jpeg_decode_block
                                           (psVar48,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            psVar48->huff_dc[paVar1[iVar44].hd].fast,
                                            (stbi__huffman *)
                                            psVar48->huff_ac[paVar1[iVar44].ha].fast,
                                            psVar48->fast_ac[paVar1[iVar44].ha],iVar44,
                                            psVar48->dequant[paVar1[iVar44].tq]);
                        uVar71 = extraout_EDX_02;
                        if (iVar45 == 0) goto LAB_00195d00;
                        (*psVar48->idct_block_kernel)
                                  (paVar1[iVar44].data + lVar59 + iVar69 * paVar1[iVar44].w2,
                                   paVar1[iVar44].w2,(short *)&local_88a8);
                        uVar71 = (uint)extraout_RDX_03;
                        iVar45 = psVar48->todo;
                        psVar48->todo = iVar45 + -1;
                        uVar70 = extraout_RDX_03;
                        if (iVar45 < 2) {
                          if (psVar48->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar48);
                            uVar71 = extraout_EDX_03;
                          }
                          if ((psVar48->marker & 0xf8) != 0xd0) goto LAB_00195cf9;
                          psVar48->code_buffer = 0;
                          psVar48->code_bits = 0;
                          psVar48->nomore = 0;
                          psVar48->img_comp[3].dc_pred = 0;
                          psVar48->img_comp[2].dc_pred = 0;
                          psVar48->img_comp[1].dc_pred = 0;
                          psVar48->img_comp[0].dc_pred = 0;
                          psVar48->marker = 0xff;
                          iVar45 = psVar48->restart_interval;
                          uVar70 = 0x7fffffff;
                          if (iVar45 == 0) {
                            iVar45 = 0x7fffffff;
                          }
                          psVar48->todo = iVar45;
                          psVar48->eob_run = 0;
                        }
                        lVar59 = lVar59 + 8;
                      } while ((ulong)uVar54 * 8 != lVar59);
                    }
                    uVar71 = (uint)uVar70;
                    iVar66 = iVar66 + 1;
                    iVar69 = iVar69 + 8;
                  } while (iVar66 != iVar63);
LAB_00195cf9:
                  bVar75 = true;
                }
              }
              else {
                uVar71 = psVar48->img_mcu_y;
                uVar70 = (ulong)uVar71;
                bVar75 = true;
                if (0 < (int)uVar71) {
                  iVar44 = psVar48->img_mcu_x;
                  iVar66 = 0;
                  do {
                    if (0 < iVar44) {
                      uVar54 = 0;
                      do {
                        iVar44 = psVar48->scan_n;
                        if (0 < iVar44) {
                          uVar70 = 0;
                          do {
                            iVar63 = psVar48->order[uVar70];
                            iVar69 = psVar48->img_comp[iVar63].v;
                            if (0 < iVar69) {
                              iVar44 = paVar1[iVar63].h;
                              iVar45 = 0;
                              do {
                                if (0 < iVar44) {
                                  iVar69 = 0;
                                  do {
                                    iVar46 = paVar1[iVar63].v;
                                    iVar47 = stbi__jpeg_decode_block
                                                       (psVar48,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        psVar48->huff_dc[paVar1[iVar63].hd].fast,
                                                        (stbi__huffman *)
                                                        psVar48->huff_ac[paVar1[iVar63].ha].fast,
                                                        psVar48->fast_ac[paVar1[iVar63].ha],iVar63,
                                                        psVar48->dequant[paVar1[iVar63].tq]);
                                    uVar71 = extraout_EDX_05;
                                    if (iVar47 == 0) goto LAB_00195d00;
                                    (*psVar48->idct_block_kernel)
                                              (paVar1[iVar63].data +
                                               (long)(int)((iVar44 * uVar54 + iVar69) * 8) +
                                               (long)((iVar46 * iVar66 + iVar45) * paVar1[iVar63].w2
                                                     * 8),paVar1[iVar63].w2,(short *)&local_88a8);
                                    iVar69 = iVar69 + 1;
                                    iVar44 = paVar1[iVar63].h;
                                  } while (iVar69 < iVar44);
                                  iVar69 = paVar1[iVar63].v;
                                }
                                iVar45 = iVar45 + 1;
                              } while (iVar45 < iVar69);
                              iVar44 = psVar48->scan_n;
                            }
                            uVar70 = uVar70 + 1;
                          } while ((long)uVar70 < (long)iVar44);
                          iVar63 = psVar48->todo;
                        }
                        uVar71 = (uint)uVar70;
                        psVar48->todo = iVar63 + -1;
                        bVar75 = iVar63 < 2;
                        iVar63 = iVar63 + -1;
                        if (bVar75) {
                          if (psVar48->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar48);
                            uVar71 = extraout_EDX_06;
                          }
                          if ((psVar48->marker & 0xf8) != 0xd0) goto LAB_00195cf9;
                          psVar48->code_buffer = 0;
                          psVar48->code_bits = 0;
                          psVar48->nomore = 0;
                          psVar48->img_comp[3].dc_pred = 0;
                          psVar48->img_comp[2].dc_pred = 0;
                          psVar48->img_comp[1].dc_pred = 0;
                          psVar48->img_comp[0].dc_pred = 0;
                          psVar48->marker = 0xff;
                          iVar63 = psVar48->restart_interval;
                          if (iVar63 == 0) {
                            iVar63 = 0x7fffffff;
                          }
                          psVar48->todo = iVar63;
                          psVar48->eob_run = 0;
                        }
                        uVar54 = uVar54 + 1;
                        uVar70 = (ulong)uVar54;
                        iVar44 = psVar48->img_mcu_x;
                      } while ((int)uVar54 < iVar44);
                      uVar70 = (ulong)(uint)psVar48->img_mcu_y;
                    }
                    iVar66 = iVar66 + 1;
                    uVar71 = (uint)uVar70;
                  } while (iVar66 < (int)uVar71);
                  goto LAB_00195cf9;
                }
              }
              goto LAB_00195d02;
            }
            if (uVar71 == 1) {
              local_88b8 = (ulong)psVar48->order[0];
              iVar44 = psVar48->img_comp[local_88b8].y + 7 >> 3;
              if (0 < iVar44) {
                local_88d0 = paVar1 + local_88b8;
                iVar66 = psVar48->img_comp[local_88b8].x + 7 >> 3;
                iVar63 = 0;
                do {
                  if (0 < iVar66) {
                    iVar69 = 0;
                    do {
                      psVar72 = local_88d0->coeff + (local_88d0->coeff_w * iVar63 + iVar69) * 0x40;
                      uVar70 = (ulong)psVar48->spec_start;
                      if (uVar70 == 0) {
                        iVar45 = stbi__jpeg_decode_block_prog_dc
                                           (psVar48,psVar72,
                                            (stbi__huffman *)psVar48->huff_dc[local_88d0->hd].fast,
                                            (int)local_88b8);
                        uVar71 = extraout_EDX_01;
                        if (iVar45 == 0) goto LAB_001963b6;
                      }
                      else {
                        iVar45 = local_88d0->ha;
                        psVar60 = psVar48->huff_ac[iVar45].fast;
                        iVar46 = psVar48->eob_run;
                        bVar38 = (byte)psVar48->succ_low;
                        if (psVar48->succ_high == 0) {
                          if (iVar46 == 0) {
                            do {
                              if (psVar48->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar48);
                              }
                              sVar56 = psVar48->fast_ac[iVar45][psVar48->code_buffer >> 0x17];
                              uVar71 = (uint)sVar56;
                              iVar46 = (int)uVar70;
                              if (sVar56 == 0) {
                                uVar71 = stbi__jpeg_huff_decode(psVar48,(stbi__huffman *)psVar60);
                                paVar58 = extraout_RDX_02;
                                if ((int)uVar71 < 0) goto LAB_0019694a;
                                uVar54 = uVar71 >> 4;
                                if ((uVar71 & 0xf) == 0) {
                                  if (uVar71 < 0xf0) {
                                    iVar46 = 1 << ((byte)uVar54 & 0x1f);
                                    psVar48->eob_run = iVar46;
                                    if (0xf < uVar71) {
                                      iVar46 = stbi__jpeg_get_bits(psVar48,uVar54);
                                      iVar46 = iVar46 + psVar48->eob_run;
                                    }
                                    goto LAB_001953d3;
                                  }
                                  uVar70 = (ulong)(iVar46 + 0x10);
                                }
                                else {
                                  uVar70 = (ulong)((int)((long)iVar46 + (ulong)uVar54) + 1);
                                  bVar42 = ""[(long)iVar46 + (ulong)uVar54];
                                  iVar46 = stbi__extend_receive(psVar48,uVar71 & 0xf);
                                  psVar72[bVar42] = (short)(iVar46 << (bVar38 & 0x1f));
                                }
                              }
                              else {
                                lVar59 = (long)iVar46 + (ulong)(uVar71 >> 4 & 0xf);
                                psVar48->code_buffer = psVar48->code_buffer << (sbyte)(uVar71 & 0xf)
                                ;
                                psVar48->code_bits = psVar48->code_bits - (uVar71 & 0xf);
                                uVar70 = (ulong)((int)lVar59 + 1);
                                psVar72[""[lVar59]] = (short)((uVar71 >> 8) << (bVar38 & 0x1f));
                              }
                            } while ((int)uVar70 <= psVar48->spec_end);
                          }
                          else {
LAB_001953d3:
                            psVar48->eob_run = iVar46 + -1;
                          }
                        }
                        else if (iVar46 == 0) {
                          iVar45 = 0x10000 << (bVar38 & 0x1f);
                          do {
                            uVar71 = stbi__jpeg_huff_decode(psVar48,(stbi__huffman *)psVar60);
                            paVar58 = extraout_RDX_01;
                            if ((int)uVar71 < 0) goto LAB_0019694a;
                            uVar54 = uVar71 >> 4;
                            if ((uVar71 & 0xf) == 1) {
                              iVar47 = stbi__jpeg_get_bit(psVar48);
                              iVar46 = 1;
                              if (iVar47 == 0) {
                                iVar46 = 0xffff;
                              }
                              sVar56 = (short)(iVar46 << (bVar38 & 0x1f));
                            }
                            else {
                              if ((uVar71 & 0xf) != 0) goto LAB_0019694a;
                              if (uVar71 < 0xf0) {
                                psVar48->eob_run = ~(-1 << ((byte)uVar54 & 0x1f));
                                uVar65 = 0x40;
                                if (0xf < uVar71) {
                                  iVar46 = stbi__jpeg_get_bits(psVar48,uVar54);
                                  psVar48->eob_run = psVar48->eob_run + iVar46;
                                }
                              }
                              else {
                                uVar65 = 0xf;
                              }
                              uVar54 = uVar65;
                              sVar56 = 0;
                            }
                            uVar71 = psVar48->spec_end;
                            uVar49 = (ulong)uVar71;
                            if ((int)uVar70 <= (int)uVar71) {
                              uVar64 = (long)(int)uVar70;
                              do {
                                uVar71 = (uint)uVar49;
                                bVar42 = ""[uVar64];
                                if (psVar72[bVar42] == 0) {
                                  if (uVar54 == 0) {
                                    uVar70 = (ulong)((int)uVar64 + 1);
                                    psVar72[bVar42] = sVar56;
                                    break;
                                  }
                                  uVar54 = uVar54 - 1;
                                }
                                else {
                                  iVar46 = stbi__jpeg_get_bit(psVar48);
                                  if ((iVar46 != 0) &&
                                     (sVar3 = psVar72[bVar42], (iVar45 >> 0x10 & (int)sVar3) == 0))
                                  {
                                    sVar29 = (short)((uint)iVar45 >> 0x10);
                                    if (sVar3 < 1) {
                                      sVar29 = -sVar29;
                                    }
                                    psVar72[bVar42] = sVar3 + sVar29;
                                  }
                                }
                                uVar70 = uVar64 + 1;
                                uVar71 = psVar48->spec_end;
                                uVar49 = (ulong)(int)uVar71;
                                bVar75 = (long)uVar64 < (long)uVar49;
                                uVar64 = uVar70;
                              } while (bVar75);
                            }
                          } while ((int)uVar70 <= (int)uVar71);
                        }
                        else {
                          psVar48->eob_run = iVar46 + -1;
                          if (psVar48->spec_start <= psVar48->spec_end) {
                            uVar71 = (0x10000 << (bVar38 & 0x1f)) >> 0x10;
                            do {
                              bVar38 = ""[uVar70];
                              if (((psVar72[bVar38] != 0) &&
                                  (iVar45 = stbi__jpeg_get_bit(psVar48), iVar45 != 0)) &&
                                 (sVar56 = psVar72[bVar38], (uVar71 & (int)sVar56) == 0)) {
                                uVar54 = -uVar71;
                                if (0 < sVar56) {
                                  uVar54 = uVar71;
                                }
                                psVar72[bVar38] = (short)uVar54 + sVar56;
                              }
                              bVar75 = (long)uVar70 < (long)psVar48->spec_end;
                              uVar70 = uVar70 + 1;
                            } while (bVar75);
                          }
                        }
                      }
                      iVar45 = psVar48->todo;
                      psVar48->todo = iVar45 + -1;
                      if (iVar45 < 2) {
                        if (psVar48->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar48);
                        }
                        bVar38 = psVar48->marker;
                        if ((bVar38 & 0xf8) != 0xd0) goto LAB_00195d15;
                        psVar48->code_buffer = 0;
                        psVar48->code_bits = 0;
                        psVar48->nomore = 0;
                        psVar48->img_comp[3].dc_pred = 0;
                        psVar48->img_comp[2].dc_pred = 0;
                        psVar48->img_comp[1].dc_pred = 0;
                        psVar48->img_comp[0].dc_pred = 0;
                        psVar48->marker = 0xff;
                        iVar45 = psVar48->restart_interval;
                        if (iVar45 == 0) {
                          iVar45 = 0x7fffffff;
                        }
                        psVar48->todo = iVar45;
                        psVar48->eob_run = 0;
                      }
                      iVar69 = iVar69 + 1;
                    } while (iVar69 != iVar66);
                  }
                  iVar63 = iVar63 + 1;
                } while (iVar63 != iVar44);
              }
            }
            else {
              iVar44 = psVar48->img_mcu_y;
              if (0 < iVar44) {
                iVar66 = psVar48->img_mcu_x;
                iVar69 = 0;
                do {
                  if (0 < iVar66) {
                    iVar44 = 0;
                    do {
                      iVar66 = psVar48->scan_n;
                      if (0 < iVar66) {
                        lVar59 = 0;
                        do {
                          iVar63 = psVar48->order[lVar59];
                          iVar45 = psVar48->img_comp[iVar63].v;
                          if (0 < iVar45) {
                            iVar66 = paVar1[iVar63].h;
                            iVar46 = 0;
                            do {
                              if (0 < iVar66) {
                                iVar45 = 0;
                                do {
                                  iVar66 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar48,paVar1[iVar63].coeff +
                                                              (iVar66 * iVar44 + iVar45 +
                                                              (paVar1[iVar63].v * iVar69 + iVar46) *
                                                              paVar1[iVar63].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar48->huff_dc[paVar1[iVar63].hd].fast,
                                                      iVar63);
                                  uVar71 = extraout_EDX_04;
                                  if (iVar66 == 0) goto LAB_001963b6;
                                  iVar45 = iVar45 + 1;
                                  iVar66 = paVar1[iVar63].h;
                                } while (iVar45 < iVar66);
                                iVar45 = paVar1[iVar63].v;
                              }
                              iVar46 = iVar46 + 1;
                            } while (iVar46 < iVar45);
                            iVar66 = psVar48->scan_n;
                          }
                          lVar59 = lVar59 + 1;
                        } while (lVar59 < iVar66);
                        iVar63 = psVar48->todo;
                      }
                      psVar48->todo = iVar63 + -1;
                      bVar75 = iVar63 < 2;
                      iVar63 = iVar63 + -1;
                      if (bVar75) {
                        if (psVar48->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar48);
                        }
                        bVar38 = psVar48->marker;
                        if ((bVar38 & 0xf8) != 0xd0) goto LAB_00195d15;
                        psVar48->code_buffer = 0;
                        psVar48->code_bits = 0;
                        psVar48->nomore = 0;
                        psVar48->img_comp[3].dc_pred = 0;
                        psVar48->img_comp[2].dc_pred = 0;
                        psVar48->img_comp[1].dc_pred = 0;
                        psVar48->img_comp[0].dc_pred = 0;
                        psVar48->marker = 0xff;
                        iVar63 = psVar48->restart_interval;
                        if (iVar63 == 0) {
                          iVar63 = 0x7fffffff;
                        }
                        psVar48->todo = iVar63;
                        psVar48->eob_run = 0;
                      }
                      iVar44 = iVar44 + 1;
                      iVar66 = psVar48->img_mcu_x;
                    } while (iVar44 < iVar66);
                    iVar44 = psVar48->img_mcu_y;
                  }
                  iVar69 = iVar69 + 1;
                } while (iVar69 < iVar44);
              }
            }
            goto LAB_00195d0a;
          }
          stbi__g_failure_reason = "bad SOS component count";
          paVar58 = extraout_RDX_00;
          goto LAB_001963af;
        }
        uVar71 = (uint)bVar38;
        if (uVar71 == 0xdc) {
          psVar53 = psVar48->s;
          sVar37 = stbi__get8(psVar53);
          sVar39 = stbi__get8(psVar53);
          psVar53 = psVar48->s;
          sVar40 = stbi__get8(psVar53);
          sVar41 = stbi__get8(psVar53);
          paVar58 = extraout_RDX;
          if (CONCAT11(sVar37,sVar39) == 4) {
            if ((uint)CONCAT11(sVar40,sVar41) == psVar48->s->img_y) goto LAB_00194fe7;
            stbi__g_failure_reason = "bad DNL height";
          }
          else {
            stbi__g_failure_reason = "bad DNL len";
          }
          goto LAB_001963af;
        }
        if (uVar71 == 0xd9) {
          psVar74 = psVar48->s;
          uVar71 = psVar74->img_n;
          if (psVar48->progressive == 0) goto LAB_00196354;
          if ((int)uVar71 < 1) {
            uVar54 = req_comp + (uint)(req_comp == 0);
            bVar75 = false;
          }
          else {
            lVar59 = 0;
            do {
              iVar44 = psVar48->img_comp[lVar59].y + 7 >> 3;
              if (0 < iVar44) {
                uVar71 = paVar1[lVar59].x + 7 >> 3;
                iVar63 = 0;
                do {
                  if (0 < (int)uVar71) {
                    uVar70 = 0;
                    do {
                      psVar72 = paVar1[lVar59].coeff +
                                (paVar1[lVar59].coeff_w * iVar63 + (int)uVar70) * 0x40;
                      iVar66 = paVar1[lVar59].tq;
                      lVar55 = 0;
                      do {
                        psVar72[lVar55] = psVar72[lVar55] * psVar48->dequant[iVar66][lVar55];
                        lVar55 = lVar55 + 1;
                      } while (lVar55 != 0x40);
                      (*psVar48->idct_block_kernel)
                                (paVar1[lVar59].data +
                                 uVar70 * 8 + (long)(iVar63 * 8 * paVar1[lVar59].w2),
                                 paVar1[lVar59].w2,psVar72);
                      uVar70 = uVar70 + 1;
                    } while (uVar70 != uVar71);
                  }
                  iVar63 = iVar63 + 1;
                } while (iVar63 != iVar44);
                psVar74 = psVar48->s;
              }
              lVar59 = lVar59 + 1;
              uVar71 = psVar74->img_n;
            } while (lVar59 < (int)uVar71);
LAB_00196354:
            uVar54 = (2 < (int)uVar71) + 1 + (uint)(2 < (int)uVar71);
            if (req_comp != 0) {
              uVar54 = req_comp;
            }
            uVar65 = uVar71;
            if (uVar71 == 3) {
              bVar75 = true;
              uVar71 = 3;
              if (psVar48->rgb != 3) {
                uVar65 = 3;
                if (psVar48->app14_color_transform != 0) goto LAB_0019638f;
                bVar75 = psVar48->jfif == 0;
              }
            }
            else {
LAB_0019638f:
              uVar71 = uVar65;
              bVar75 = false;
            }
          }
          uVar65 = 1;
          if (bVar75) {
            uVar65 = uVar71;
          }
          if (uVar71 != 3) {
            uVar65 = uVar71;
          }
          if (2 < (int)uVar54) {
            uVar65 = uVar71;
          }
          local_88e8 = (undefined1  [16])0x0;
          _local_88f8 = (undefined1  [16])0x0;
          sVar43 = psVar74->img_x;
          if ((int)uVar65 < 1) {
LAB_00197347:
            sVar4 = psVar74->img_y;
            psVar53 = (stbi__context *)stbi__malloc_mad3(uVar54,sVar43,sVar4,1);
            iVar44 = (int)extraout_RDX_04;
            if (psVar53 != (stbi__context *)0x0) {
              if (sVar4 != 0) {
                local_88d0 = (anon_struct_96_18_0d0905d3 *)((long)&psVar53->img_x + 2);
                iVar63 = 0;
                uVar71 = 0;
                psVar60 = extraout_RDX_04;
                do {
                  sVar43 = psVar74->img_x;
                  if (0 < (int)uVar65) {
                    pasVar73 = (stbi_uc (*) [4])&local_88a8.ratio;
                    uVar70 = 0;
                    piVar68 = &psVar48->img_comp[0].y;
                    do {
                      asVar5 = pasVar73[-1];
                      asVar6 = pasVar73[-3];
                      iVar44 = (int)asVar6 >> 1;
                      auVar114 = (**(code **)(pasVar73 + -10))
                                           (*(stbi_uc **)(piVar68 + 10),
                                            *(undefined8 *)
                                             (*pasVar73 +
                                             ((ulong)(iVar44 <= (int)asVar5) << 3 |
                                             0xffffffffffffffe0)),
                                            *(undefined8 *)
                                             (*pasVar73 +
                                             ((ulong)((int)asVar5 < iVar44) << 3 |
                                             0xffffffffffffffe0)),pasVar73[-2],pasVar73[-4]);
                      psVar60 = auVar114._8_8_;
                      *(long *)(local_88f8 + uVar70 * 8) = auVar114._0_8_;
                      pasVar73[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar6 <= (int)asVar5 + 1) {
                        pasVar73[-1] = (stbi_uc  [4])0x0;
                        *(stbi_uc **)(pasVar73 + -8) = *(stbi_uc **)(pasVar73 + -6);
                        asVar5 = *pasVar73;
                        *pasVar73 = (stbi_uc  [4])((int)asVar5 + 1);
                        if ((int)asVar5 + 1 < *piVar68) {
                          *(stbi_uc **)(pasVar73 + -6) = *(stbi_uc **)(pasVar73 + -6) + piVar68[1];
                        }
                      }
                      uVar70 = uVar70 + 1;
                      piVar68 = piVar68 + 0x18;
                      pasVar73 = pasVar73 + 0xc;
                    } while (uVar65 != uVar70);
                  }
                  if ((int)uVar54 < 3) {
                    psVar74 = psVar48->s;
                    if (bVar75) {
                      if (uVar54 == 1) {
                        if (psVar74->img_x != 0) {
                          uVar70 = 0;
                          do {
                            bVar38 = *(byte *)(local_88e8._0_8_ + uVar70);
                            psVar53->buffer_start[uVar70 + sVar43 * iVar63 + -0x38] =
                                 (stbi_uc)((uint)bVar38 * 2 + ((uint)bVar38 + (uint)bVar38 * 8) * 3
                                           + (uint)stack0xffffffffffff7710[uVar70] * 0x96 +
                                             (uint)*(byte *)(local_88f8._0_8_ + uVar70) * 0x4d >> 8)
                            ;
                            uVar70 = uVar70 + 1;
                            psVar60 = (stbi_uc *)local_88e8._0_8_;
                          } while (uVar70 < psVar74->img_x);
                        }
                      }
                      else if (psVar74->img_x != 0) {
                        uVar70 = 0;
                        do {
                          bVar38 = *(byte *)(local_88e8._0_8_ + uVar70);
                          psVar53->buffer_start[uVar70 * 2 + (ulong)(sVar43 * iVar63) + -0x38] =
                               (stbi_uc)((uint)bVar38 * 2 + ((uint)bVar38 + (uint)bVar38 * 8) * 3 +
                                         (uint)stack0xffffffffffff7710[uVar70] * 0x96 +
                                         (uint)*(byte *)(local_88f8._0_8_ + uVar70) * 0x4d >> 8);
                          psVar53->buffer_start[uVar70 * 2 + (ulong)(sVar43 * iVar63) + -0x37] =
                               0xff;
                          uVar70 = uVar70 + 1;
                          psVar60 = (stbi_uc *)local_88e8._0_8_;
                        } while (uVar70 < psVar74->img_x);
                      }
                    }
                    else if (psVar74->img_n == 4) {
                      if (psVar48->app14_color_transform == 2) {
                        if (psVar74->img_x != 0) {
                          psVar61 = psVar53->buffer_start + ((ulong)(sVar43 * iVar63) - 0x37);
                          psVar60 = (stbi_uc *)0x0;
                          do {
                            iVar44 = (*(byte *)(local_88f8._0_8_ + (long)psVar60) ^ 0xff) *
                                     (uint)psVar60[local_88e8._8_8_];
                            psVar61[-1] = (char)((iVar44 + 0x80U >> 8) + iVar44 + 0x80 >> 8);
                            *psVar61 = 0xff;
                            psVar60 = psVar60 + 1;
                            psVar61 = psVar61 + uVar54;
                          } while (psVar60 < (stbi_uc *)(ulong)psVar74->img_x);
                        }
                      }
                      else {
                        if (psVar48->app14_color_transform != 0) goto LAB_0019779e;
                        if (psVar74->img_x != 0) {
                          psVar61 = psVar53->buffer_start + ((ulong)(sVar43 * iVar63) - 0x37);
                          uVar70 = 0;
                          do {
                            bVar38 = *(byte *)(local_88e8._8_8_ + uVar70);
                            iVar44 = (uint)*(byte *)(local_88f8._0_8_ + uVar70) * (uint)bVar38;
                            iVar66 = (uint)stack0xffffffffffff7710[uVar70] * (uint)bVar38;
                            psVar61[-1] = (char)((((uint)*(byte *)(local_88e8._0_8_ + uVar70) *
                                                   (uint)bVar38 + 0x80 >> 8) +
                                                  (uint)*(byte *)(local_88e8._0_8_ + uVar70) *
                                                  (uint)bVar38 + 0x80 >> 8) * 0x1d +
                                                 (iVar66 + (iVar66 + 0x80U >> 8) + 0x80 >> 8) * 0x96
                                                 + (iVar44 + (iVar44 + 0x80U >> 8) + 0x80 >> 8) *
                                                   0x4d >> 8);
                            *psVar61 = 0xff;
                            uVar70 = uVar70 + 1;
                            psVar61 = psVar61 + uVar54;
                            psVar60 = stack0xffffffffffff7710;
                          } while (uVar70 < psVar74->img_x);
                        }
                      }
                    }
                    else {
LAB_0019779e:
                      if (uVar54 == 1) {
                        if (psVar74->img_x != 0) {
                          psVar61 = (stbi_uc *)0x0;
                          do {
                            (psVar53->buffer_start + ((ulong)(sVar43 * iVar63) - 0x38))
                            [(long)psVar61] = *(stbi_uc *)(local_88f8._0_8_ + (long)psVar61);
                            psVar61 = psVar61 + 1;
                            psVar60 = (stbi_uc *)(ulong)psVar74->img_x;
                          } while (psVar61 < (stbi_uc *)(ulong)psVar74->img_x);
                        }
                      }
                      else if (psVar74->img_x != 0) {
                        psVar61 = (stbi_uc *)0x0;
                        do {
                          psVar53->buffer_start
                          [(long)psVar61 * 2 + (ulong)(sVar43 * iVar63) + -0x38] =
                               *(stbi_uc *)(local_88f8._0_8_ + (long)psVar61);
                          psVar53->buffer_start
                          [(long)psVar61 * 2 + (ulong)(sVar43 * iVar63) + -0x37] = 0xff;
                          psVar61 = psVar61 + 1;
                          psVar60 = (stbi_uc *)(ulong)psVar74->img_x;
                        } while (psVar61 < (stbi_uc *)(ulong)psVar74->img_x);
                      }
                    }
                  }
                  else {
                    psVar74 = psVar48->s;
                    if (psVar74->img_n == 3) {
                      if (bVar75) {
                        if (psVar74->img_x != 0) {
                          psVar61 = psVar53->buffer_start + ((ulong)(sVar43 * iVar63) - 0x35);
                          psVar60 = (stbi_uc *)0x0;
                          do {
                            psVar61[-3] = *(stbi_uc *)(local_88f8._0_8_ + (long)psVar60);
                            psVar61[-2] = stack0xffffffffffff7710[(long)psVar60];
                            psVar61[-1] = *(stbi_uc *)(local_88e8._0_8_ + (long)psVar60);
                            *psVar61 = 0xff;
                            psVar60 = psVar60 + 1;
                            psVar61 = psVar61 + uVar54;
                          } while (psVar60 < (stbi_uc *)(ulong)psVar74->img_x);
                        }
                      }
                      else {
LAB_00197811:
                        (*psVar48->YCbCr_to_RGB_kernel)
                                  (psVar53->buffer_start +
                                   ((ulong)(uVar71 * uVar54 * sVar43) - 0x38),
                                   (stbi_uc *)local_88f8._0_8_,stack0xffffffffffff7710,
                                   (stbi_uc *)local_88e8._0_8_,psVar74->img_x,uVar54);
                        psVar74 = psVar48->s;
                        psVar60 = extraout_RDX_05;
                      }
                    }
                    else if (psVar74->img_n == 4) {
                      if (psVar48->app14_color_transform == 2) {
                        (*psVar48->YCbCr_to_RGB_kernel)
                                  (psVar53->buffer_start +
                                   ((ulong)(uVar71 * uVar54 * sVar43) - 0x38),
                                   (stbi_uc *)local_88f8._0_8_,stack0xffffffffffff7710,
                                   (stbi_uc *)local_88e8._0_8_,psVar74->img_x,uVar54);
                        psVar74 = psVar48->s;
                        psVar60 = extraout_RDX_06;
                        if (psVar74->img_x != 0) {
                          pbVar62 = (byte *)((long)&local_88d0->id + (ulong)(sVar43 * iVar63));
                          uVar70 = 0;
                          do {
                            bVar38 = *(byte *)(local_88e8._8_8_ + uVar70);
                            iVar44 = (pbVar62[-2] ^ 0xff) * (uint)bVar38;
                            pbVar62[-2] = (byte)((iVar44 + 0x80U >> 8) + iVar44 + 0x80 >> 8);
                            iVar44 = (pbVar62[-1] ^ 0xff) * (uint)bVar38;
                            pbVar62[-1] = (byte)(iVar44 + (iVar44 + 0x80U >> 8) + 0x80 >> 8);
                            iVar44 = (*pbVar62 ^ 0xff) * (uint)bVar38;
                            uVar57 = iVar44 + 0x80U >> 8;
                            *pbVar62 = (byte)(iVar44 + uVar57 + 0x80 >> 8);
                            uVar70 = uVar70 + 1;
                            pbVar62 = pbVar62 + uVar54;
                            psVar60 = (stbi_uc *)(ulong)uVar57;
                          } while (uVar70 < psVar74->img_x);
                        }
                      }
                      else {
                        if (psVar48->app14_color_transform != 0) goto LAB_00197811;
                        if (psVar74->img_x != 0) {
                          psVar61 = psVar53->buffer_start + ((ulong)(sVar43 * iVar63) - 0x35);
                          uVar70 = 0;
                          do {
                            bVar38 = *(byte *)(local_88e8._8_8_ + uVar70);
                            iVar44 = (uint)*(byte *)(local_88f8._0_8_ + uVar70) * (uint)bVar38;
                            psVar61[-3] = (char)((iVar44 + 0x80U >> 8) + iVar44 + 0x80 >> 8);
                            iVar44 = (uint)stack0xffffffffffff7710[uVar70] * (uint)bVar38;
                            psVar61[-2] = (char)(iVar44 + (iVar44 + 0x80U >> 8) + 0x80 >> 8);
                            psVar61[-1] = (char)((uint)*(byte *)(local_88e8._0_8_ + uVar70) *
                                                 (uint)bVar38 +
                                                 ((uint)*(byte *)(local_88e8._0_8_ + uVar70) *
                                                  (uint)bVar38 + 0x80 >> 8) + 0x80 >> 8);
                            *psVar61 = 0xff;
                            uVar70 = uVar70 + 1;
                            psVar61 = psVar61 + uVar54;
                            psVar60 = (stbi_uc *)local_88e8._0_8_;
                          } while (uVar70 < psVar74->img_x);
                        }
                      }
                    }
                    else if (psVar74->img_x != 0) {
                      psVar61 = psVar53->buffer_start + ((ulong)(sVar43 * iVar63) - 0x35);
                      uVar70 = 0;
                      do {
                        sVar37 = *(stbi_uc *)(local_88f8._0_8_ + uVar70);
                        psVar61[-1] = sVar37;
                        psVar61[-2] = sVar37;
                        psVar61[-3] = sVar37;
                        *psVar61 = 0xff;
                        uVar70 = uVar70 + 1;
                        psVar61 = psVar61 + uVar54;
                      } while (uVar70 < psVar74->img_x);
                    }
                  }
                  iVar44 = (int)psVar60;
                  uVar71 = uVar71 + 1;
                  iVar63 = iVar63 + uVar54;
                } while (uVar71 < psVar74->img_y);
                uVar71 = psVar74->img_n;
              }
              stbi__free_jpeg_components(psVar48,uVar71,iVar44);
              psVar74 = psVar48->s;
              *x = psVar74->img_x;
              *y = psVar74->img_y;
              if (comp != (int *)0x0) {
                *comp = (uint)(2 < psVar74->img_n) * 2 + 1;
              }
              goto LAB_001963d0;
            }
          }
          else {
            lVar59 = 0;
            while( true ) {
              pvVar51 = malloc((ulong)(sVar43 + 3));
              *(void **)((long)&psVar48->img_comp[0].linebuf + lVar59 * 2) = pvVar51;
              iVar44 = extraout_EDX_07;
              if (pvVar51 == (void *)0x0) break;
              uVar70 = (long)psVar48->img_h_max /
                       (long)*(int *)((long)&psVar48->img_comp[0].h + lVar59 * 2);
              iVar44 = (int)uVar70;
              *(int *)((long)(local_88a8.pal + -7) + lVar59) = iVar44;
              iVar63 = psVar48->img_v_max / *(int *)((long)&psVar48->img_comp[0].v + lVar59 * 2);
              *(int *)((long)(local_88a8.pal + -6) + lVar59) = iVar63;
              *(int *)((long)(local_88a8.pal + -4) + lVar59) = iVar63 >> 1;
              *(int *)((long)(local_88a8.pal + -5) + lVar59) =
                   (int)((ulong)((sVar43 - 1) + iVar44) / (uVar70 & 0xffffffff));
              *(undefined4 *)((long)(local_88a8.pal + -3) + lVar59) = 0;
              uVar7 = *(undefined8 *)((long)&psVar48->img_comp[0].data + lVar59 * 2);
              *(undefined8 *)((long)(local_88a8.pal + -9) + lVar59) = uVar7;
              *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar59) = uVar7;
              if (iVar44 == 2) {
                pcVar52 = stbi__resample_row_h_2;
                if (iVar63 != 1) {
                  if (iVar63 != 2) goto LAB_0019732b;
                  pcVar52 = psVar48->resample_row_hv_2_kernel;
                }
              }
              else if (iVar44 == 1) {
                pcVar52 = stbi__resample_row_generic;
                if (iVar63 == 2) {
                  pcVar52 = stbi__resample_row_v_2;
                }
                if (iVar63 == 1) {
                  pcVar52 = resample_row_1;
                }
              }
              else {
LAB_0019732b:
                pcVar52 = stbi__resample_row_generic;
              }
              *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar59) = pcVar52;
              lVar59 = lVar59 + 0x30;
              if ((ulong)uVar65 * 0x30 == lVar59) goto LAB_00197347;
            }
          }
          stbi__free_jpeg_components(psVar48,uVar71,iVar44);
          stbi__g_failure_reason = "outofmem";
          goto LAB_001963ca;
        }
        iVar44 = stbi__process_marker(psVar48,uVar71);
        uVar71 = extraout_EDX_00;
        if (iVar44 != 0) goto LAB_00194fe7;
      }
LAB_001963b6:
      stbi__free_jpeg_components(psVar48,psVar48->s->img_n,uVar71);
LAB_001963ca:
      psVar53 = (stbi__context *)0x0;
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
      psVar53 = (stbi__context *)0x0;
    }
  }
  else {
    lVar59 = 0;
    do {
      sVar37 = stbi__get8(s);
      if (sVar37 != (&stbi__check_png_header_png_sig)[lVar59]) {
        stbi__g_failure_reason = "bad png sig";
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        sVar37 = stbi__get8(s);
        if ((sVar37 == 'B') && (sVar37 = stbi__get8(s), sVar37 == 'M')) {
          stbi__get32le(s);
          stbi__get8(s);
          stbi__get8(s);
          stbi__get8(s);
          stbi__get8(s);
          stbi__get32le(s);
          sVar43 = stbi__get32le(s);
          if (((sVar43 < 0x39) && ((0x100010000001000U >> ((ulong)sVar43 & 0x3f) & 1) != 0)) ||
             (sVar43 == 0x6c)) {
            s->img_buffer = s->img_buffer_original;
            s->img_buffer_end = s->img_buffer_original_end;
          }
          else {
            s->img_buffer = s->img_buffer_original;
            s->img_buffer_end = s->img_buffer_original_end;
            if (sVar43 != 0x7c) goto LAB_00195d92;
          }
          local_88e8._12_4_ = 0xff;
          pvVar51 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_88f8);
          if (pvVar51 == (void *)0x0) {
            return (void *)0x0;
          }
          local_88b0 = s->img_y;
          sVar43 = -local_88b0;
          if (0 < (int)local_88b0) {
            sVar43 = local_88b0;
          }
          s->img_y = sVar43;
          z_01 = local_88e8._8_4_;
          uVar36 = local_88f8._8_4_;
          if (local_88f8._8_4_ == 0xc) {
            if ((int)local_88f8._0_4_ < 0x18) {
              uVar71 = (local_88f8._4_4_ + -0x26) / 3;
              goto LAB_00195fc9;
            }
LAB_00195f9c:
            uVar71 = 0;
            if (local_88f8._0_4_ != 0x18 || local_88e8._8_4_ != 0xff000000) goto LAB_00195fc9;
            iVar44 = 3;
            local_8950 = 0x18;
            bVar75 = true;
          }
          else {
            if (0xf < (int)local_88f8._0_4_) goto LAB_00195f9c;
            uVar71 = (local_88f8._4_4_ - local_88f8._8_4_) + -0xe >> 2;
LAB_00195fc9:
            bVar75 = local_88e8._8_4_ == 0xff000000;
            local_8950 = local_88f8._0_4_;
            iVar44 = 4 - (uint)(local_88e8._8_4_ == 0);
          }
          uVar54 = uStack_88ec;
          z = local_88e8._0_4_;
          z_00 = local_88e8._4_4_;
          uVar65 = local_88e8._12_4_;
          s->img_n = iVar44;
          if (2 < req_comp) {
            iVar44 = req_comp;
          }
          sVar4 = s->img_x;
          iVar63 = stbi__mad3sizes_valid(iVar44,sVar4,sVar43,0);
          if (iVar63 == 0) {
            stbi__g_failure_reason = "too large";
            return (void *)0x0;
          }
          data_00 = (uchar *)stbi__malloc_mad3(iVar44,sVar4,sVar43,0);
          if (data_00 == (uchar *)0x0) {
            stbi__g_failure_reason = "outofmem";
            return (void *)0x0;
          }
          if (local_8950 < 0x10) {
            if (0x100 < (int)uVar71 || uVar71 == 0) {
              free(data_00);
              stbi__g_failure_reason = "invalid";
              return (void *)0x0;
            }
            if (0 < (int)uVar71) {
              uVar70 = 0;
              do {
                sVar37 = stbi__get8(s);
                local_88a8.pal[uVar70 - 0xd][2] = sVar37;
                sVar37 = stbi__get8(s);
                local_88a8.pal[uVar70 - 0xd][1] = sVar37;
                sVar37 = stbi__get8(s);
                local_88a8.pal[uVar70 - 0xd][0] = sVar37;
                if (uVar36 != 0xc) {
                  stbi__get8(s);
                }
                local_88a8.pal[uVar70 - 0xd][3] = 0xff;
                uVar70 = uVar70 + 1;
              } while (uVar71 != uVar70);
            }
            stbi__skip(s,(uVar71 * (uVar36 == 0xc | 0xfffffffc) - uVar36) + local_88f8._4_4_ + -0xe)
            ;
            if (local_8950 == 1) {
              sVar43 = s->img_y;
              if (0 < (int)sVar43) {
                sVar4 = s->img_x;
                uVar70 = 0;
                iVar63 = 0;
                do {
                  bVar38 = stbi__get8(s);
                  sVar43 = s->img_x;
                  uVar49 = uVar70;
                  if (0 < (int)sVar43) {
                    uVar71 = (uint)bVar38;
                    sVar67 = 0;
                    uVar54 = 7;
                    do {
                      uVar64 = (ulong)((uVar71 >> (uVar54 & 0x1f) & 1) != 0);
                      lVar59 = (long)(int)uVar70;
                      uVar49 = lVar59 + 3;
                      data_00[lVar59] = local_88a8.pal[uVar64 - 0xd][0];
                      data_00[lVar59 + 1] = local_88a8.pal[uVar64 - 0xd][1];
                      data_00[lVar59 + 2] = local_88a8.pal[uVar64 - 0xd][2];
                      if (iVar44 == 4) {
                        data_00[lVar59 + 3] = 0xff;
                        uVar49 = (ulong)((int)uVar70 + 4);
                      }
                      sVar67 = sVar67 + 1;
                      if (sVar67 == sVar43) break;
                      if ((int)uVar54 < 1) {
                        bVar38 = stbi__get8(s);
                        uVar71 = (uint)bVar38;
                        sVar43 = s->img_x;
                        uVar54 = 7;
                      }
                      else {
                        uVar54 = uVar54 - 1;
                      }
                      uVar70 = uVar49 & 0xffffffff;
                    } while ((int)sVar67 < (int)sVar43);
                  }
                  stbi__skip(s,-(sVar4 + 7 >> 3) & 3);
                  iVar63 = iVar63 + 1;
                  sVar43 = s->img_y;
                  uVar70 = uVar49 & 0xffffffff;
                } while (iVar63 < (int)sVar43);
              }
            }
            else {
              if (local_8950 == 8) {
                uVar71 = s->img_x;
              }
              else {
                if (local_8950 != 4) {
                  free(data_00);
                  stbi__g_failure_reason = "bad bpp";
                  return (void *)0x0;
                }
                uVar71 = s->img_x + 1 >> 1;
              }
              sVar43 = s->img_y;
              if (0 < (int)sVar43) {
                local_8938 = -uVar71 & 3;
                uVar70 = 0;
                iVar63 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    iVar66 = 0;
                    do {
                      bVar38 = stbi__get8(s);
                      uVar54 = bVar38 & 0xf;
                      uVar71 = (uint)(bVar38 >> 4);
                      if (local_8950 != 4) {
                        uVar71 = (uint)bVar38;
                      }
                      uVar49 = (ulong)uVar71;
                      if (local_8950 != 4) {
                        uVar54 = 0;
                      }
                      lVar59 = (long)(int)uVar70;
                      uVar64 = lVar59 + 3;
                      data_00[lVar59] = local_88a8.pal[uVar49 - 0xd][0];
                      data_00[lVar59 + 1] = local_88a8.pal[uVar49 - 0xd][1];
                      data_00[lVar59 + 2] = local_88a8.pal[uVar49 - 0xd][2];
                      if (iVar44 == 4) {
                        data_00[lVar59 + 3] = 0xff;
                        uVar64 = (ulong)((int)uVar70 + 4);
                      }
                      if (iVar66 + 1U == s->img_x) {
                        uVar70 = uVar64 & 0xffffffff;
                        break;
                      }
                      if (local_8950 == 8) {
                        bVar38 = stbi__get8(s);
                        uVar54 = (uint)bVar38;
                      }
                      lVar59 = (long)(int)uVar64;
                      uVar70 = lVar59 + 3;
                      uVar49 = (ulong)uVar54;
                      data_00[lVar59] = local_88a8.pal[uVar49 - 0xd][0];
                      data_00[lVar59 + 1] = local_88a8.pal[uVar49 - 0xd][1];
                      data_00[lVar59 + 2] = local_88a8.pal[uVar49 - 0xd][2];
                      if (iVar44 == 4) {
                        data_00[lVar59 + 3] = 0xff;
                        uVar70 = (ulong)((int)uVar64 + 4);
                      }
                      iVar66 = iVar66 + 2;
                    } while (iVar66 < (int)s->img_x);
                  }
                  stbi__skip(s,local_8938);
                  iVar63 = iVar63 + 1;
                  sVar43 = s->img_y;
                } while (iVar63 < (int)sVar43);
              }
            }
          }
          else {
            stbi__skip(s,(local_88f8._4_4_ - uVar36) + -0xe);
            if (local_8950 == 0x10) {
              local_88fc = s->img_x * 2 & 2;
LAB_0019659f:
              if (z_00 == 0 || (z == 0 || uVar54 == 0)) {
                free(data_00);
                stbi__g_failure_reason = "bad masks";
                return (void *)0x0;
              }
              local_8970 = stbi__high_bit(uVar54);
              local_8970 = local_8970 + -7;
              uVar71 = (uVar54 >> 1 & 0x55555555) + (uVar54 & 0x55555555);
              uVar71 = (uVar71 >> 2 & 0x33333333) + (uVar71 & 0x33333333);
              uVar71 = (uVar71 >> 4) + uVar71 & 0xf0f0f0f;
              uVar71 = (uVar71 >> 8) + uVar71;
              uVar71 = (uVar71 >> 0x10) + uVar71 & 0xff;
              iVar63 = stbi__high_bit(z);
              iVar63 = iVar63 + -7;
              uVar57 = ((uint)z >> 1 & 0x55555555) + (z & 0x55555555);
              uVar57 = (uVar57 >> 2 & 0x33333333) + (uVar57 & 0x33333333);
              uVar57 = (uVar57 >> 4) + uVar57 & 0xf0f0f0f;
              uVar57 = (uVar57 >> 8) + uVar57;
              local_88d0 = (anon_struct_96_18_0d0905d3 *)
                           (CONCAT44(local_88d0._4_4_,(uVar57 >> 0x10) + uVar57) &
                           0xffffffff000000ff);
              local_892c = stbi__high_bit(z_00);
              local_892c = local_892c + -7;
              uVar57 = ((uint)z_00 >> 1 & 0x55555555) + (z_00 & 0x55555555);
              uVar57 = (uVar57 >> 2 & 0x33333333) + (uVar57 & 0x33333333);
              uVar57 = (uVar57 >> 4) + uVar57 & 0xf0f0f0f;
              uVar57 = (uVar57 >> 8) + uVar57;
              local_88b8 = CONCAT44(local_88b8._4_4_,(uVar57 >> 0x10) + uVar57) & 0xffffffff000000ff
              ;
              local_88bc = stbi__high_bit(z_01);
              local_88bc = local_88bc + -7;
              uVar57 = ((uint)z_01 >> 1 & 0x55555555) + (z_01 & 0x55555555);
              uVar57 = (uVar57 >> 2 & 0x33333333) + (uVar57 & 0x33333333);
              uVar57 = (uVar57 >> 4) + uVar57 & 0xf0f0f0f;
              uVar57 = (uVar57 >> 8) + uVar57;
              local_88c0 = (uVar57 >> 0x10) + uVar57 & 0xff;
              local_88c4 = 1;
              bVar75 = false;
            }
            else {
              if (local_8950 == 0x20) {
                local_88fc = 0;
                if (!(bool)(bVar75 & (uVar54 == 0xff0000 && (z == 0xff00 && z_00 == 0xff))))
                goto LAB_0019659f;
                bVar75 = true;
              }
              else {
                local_88fc = 0;
                if (local_8950 != 0x18) goto LAB_0019659f;
                local_88fc = s->img_x & 3;
                bVar75 = false;
              }
              local_88c4 = 0;
              local_8970 = 0;
              iVar63 = 0;
              local_892c = 0;
              local_88bc = 0;
              uVar71 = 0;
              local_88d0 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88d0 & 0xffffffff00000000);
              local_88b8 = local_88b8 & 0xffffffff00000000;
              local_88c0 = 0;
            }
            sVar43 = s->img_y;
            if (0 < (int)sVar43) {
              iVar69 = 0;
              iVar66 = 0;
              do {
                local_88ac = iVar66;
                if ((char)local_88c4 == '\0') {
                  if (0 < (int)s->img_x) {
                    iVar66 = 0;
                    do {
                      sVar37 = stbi__get8(s);
                      data_00[(long)iVar69 + 2] = sVar37;
                      sVar37 = stbi__get8(s);
                      data_00[(long)iVar69 + 1] = sVar37;
                      sVar37 = stbi__get8(s);
                      data_00[iVar69] = sVar37;
                      bVar38 = 0xff;
                      if (bVar75) {
                        bVar38 = stbi__get8(s);
                      }
                      iVar45 = iVar69 + 3;
                      if (iVar44 == 4) {
                        data_00[(long)iVar69 + 3] = bVar38;
                        iVar45 = iVar69 + 4;
                      }
                      iVar69 = iVar45;
                      uVar65 = uVar65 | bVar38;
                      iVar66 = iVar66 + 1;
                    } while (iVar66 < (int)s->img_x);
                  }
                }
                else if (0 < (int)s->img_x) {
                  iVar66 = 0;
                  do {
                    if (local_8950 == 0x10) {
                      sVar37 = stbi__get8(s);
                      sVar39 = stbi__get8(s);
                      sVar43 = (stbi__uint32)CONCAT11(sVar39,sVar37);
                    }
                    else {
                      sVar43 = stbi__get32le(s);
                    }
                    iVar45 = stbi__shiftsigned(sVar43 & uVar54,local_8970,uVar71);
                    data_00[iVar69] = (uchar)iVar45;
                    iVar45 = stbi__shiftsigned(sVar43 & z,iVar63,(int)local_88d0);
                    data_00[(long)iVar69 + 1] = (uchar)iVar45;
                    iVar45 = stbi__shiftsigned(sVar43 & z_00,local_892c,(int)local_88b8);
                    data_00[(long)iVar69 + 2] = (uchar)iVar45;
                    if (z_01 == 0) {
                      uVar57 = 0xff;
                    }
                    else {
                      uVar57 = stbi__shiftsigned(sVar43 & z_01,local_88bc,local_88c0);
                    }
                    iVar45 = iVar69 + 3;
                    if (iVar44 == 4) {
                      data_00[(long)iVar69 + 3] = (uchar)uVar57;
                      iVar45 = iVar69 + 4;
                    }
                    iVar69 = iVar45;
                    uVar65 = uVar65 | uVar57;
                    iVar66 = iVar66 + 1;
                  } while (iVar66 < (int)s->img_x);
                }
                stbi__skip(s,local_88fc);
                iVar66 = local_88ac + 1;
                sVar43 = s->img_y;
              } while (iVar66 < (int)sVar43);
            }
          }
          auVar35 = _DAT_0023e580;
          auVar34 = _DAT_0023e570;
          auVar33 = _DAT_0023e560;
          auVar32 = _DAT_0023e550;
          auVar31 = _DAT_0023b970;
          auVar30 = _DAT_0023b960;
          auVar114 = _DAT_0023a5d0;
          if (((iVar44 == 4) && (uVar65 == 0)) &&
             (uVar71 = s->img_x * sVar43 * 4 - 1, -1 < (int)uVar71)) {
            uVar54 = uVar71 >> 2;
            auVar76._4_4_ = 0;
            auVar76._0_4_ = uVar54;
            auVar76._8_4_ = uVar54;
            auVar76._12_4_ = 0;
            puVar50 = data_00 + uVar71;
            uVar70 = 0;
            do {
              auVar94._8_4_ = (int)uVar70;
              auVar94._0_8_ = uVar70;
              auVar94._12_4_ = (int)(uVar70 >> 0x20);
              auVar96 = auVar76 | auVar114;
              auVar98 = (auVar94 | auVar31) ^ auVar114;
              iVar63 = auVar96._0_4_;
              iVar46 = -(uint)(iVar63 < auVar98._0_4_);
              iVar66 = auVar96._4_4_;
              auVar100._4_4_ = -(uint)(iVar66 < auVar98._4_4_);
              iVar69 = auVar96._8_4_;
              iVar47 = -(uint)(iVar69 < auVar98._8_4_);
              iVar45 = auVar96._12_4_;
              auVar100._12_4_ = -(uint)(iVar45 < auVar98._12_4_);
              auVar77._4_4_ = iVar46;
              auVar77._0_4_ = iVar46;
              auVar77._8_4_ = iVar47;
              auVar77._12_4_ = iVar47;
              auVar77 = pshuflw(in_XMM1,auVar77,0xe8);
              auVar99._4_4_ = -(uint)(auVar98._4_4_ == iVar66);
              auVar99._12_4_ = -(uint)(auVar98._12_4_ == iVar45);
              auVar99._0_4_ = auVar99._4_4_;
              auVar99._8_4_ = auVar99._12_4_;
              auVar86 = pshuflw(in_XMM2,auVar99,0xe8);
              auVar100._0_4_ = auVar100._4_4_;
              auVar100._8_4_ = auVar100._12_4_;
              auVar98 = pshuflw(auVar77,auVar100,0xe8);
              auVar96._8_4_ = 0xffffffff;
              auVar96._0_8_ = 0xffffffffffffffff;
              auVar96._12_4_ = 0xffffffff;
              auVar96 = (auVar98 | auVar86 & auVar77) ^ auVar96;
              auVar96 = packssdw(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar50 = 0xff;
              }
              auVar86._4_4_ = iVar46;
              auVar86._0_4_ = iVar46;
              auVar86._8_4_ = iVar47;
              auVar86._12_4_ = iVar47;
              auVar100 = auVar99 & auVar86 | auVar100;
              auVar96 = packssdw(auVar100,auVar100);
              auVar98._8_4_ = 0xffffffff;
              auVar98._0_8_ = 0xffffffffffffffff;
              auVar98._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 ^ auVar98,auVar96 ^ auVar98);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._0_4_ >> 8 & 1) != 0) {
                puVar50[-4] = 0xff;
              }
              auVar96 = (auVar94 | auVar30) ^ auVar114;
              auVar87._0_4_ = -(uint)(iVar63 < auVar96._0_4_);
              auVar87._4_4_ = -(uint)(iVar66 < auVar96._4_4_);
              auVar87._8_4_ = -(uint)(iVar69 < auVar96._8_4_);
              auVar87._12_4_ = -(uint)(iVar45 < auVar96._12_4_);
              auVar101._4_4_ = auVar87._0_4_;
              auVar101._0_4_ = auVar87._0_4_;
              auVar101._8_4_ = auVar87._8_4_;
              auVar101._12_4_ = auVar87._8_4_;
              iVar46 = -(uint)(auVar96._4_4_ == iVar66);
              iVar47 = -(uint)(auVar96._12_4_ == iVar45);
              auVar17._4_4_ = iVar46;
              auVar17._0_4_ = iVar46;
              auVar17._8_4_ = iVar47;
              auVar17._12_4_ = iVar47;
              auVar111._4_4_ = auVar87._4_4_;
              auVar111._0_4_ = auVar87._4_4_;
              auVar111._8_4_ = auVar87._12_4_;
              auVar111._12_4_ = auVar87._12_4_;
              auVar96 = auVar17 & auVar101 | auVar111;
              auVar96 = packssdw(auVar96,auVar96);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 ^ auVar8,auVar96 ^ auVar8);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._0_4_ >> 0x10 & 1) != 0) {
                puVar50[-8] = 0xff;
              }
              auVar96 = pshufhw(auVar96,auVar101,0x84);
              auVar18._4_4_ = iVar46;
              auVar18._0_4_ = iVar46;
              auVar18._8_4_ = iVar47;
              auVar18._12_4_ = iVar47;
              auVar98 = pshufhw(auVar87,auVar18,0x84);
              auVar77 = pshufhw(auVar96,auVar111,0x84);
              auVar78._8_4_ = 0xffffffff;
              auVar78._0_8_ = 0xffffffffffffffff;
              auVar78._12_4_ = 0xffffffff;
              auVar78 = (auVar77 | auVar98 & auVar96) ^ auVar78;
              auVar96 = packssdw(auVar78,auVar78);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._0_4_ >> 0x18 & 1) != 0) {
                puVar50[-0xc] = 0xff;
              }
              auVar96 = (auVar94 | auVar35) ^ auVar114;
              auVar88._0_4_ = -(uint)(iVar63 < auVar96._0_4_);
              auVar88._4_4_ = -(uint)(iVar66 < auVar96._4_4_);
              auVar88._8_4_ = -(uint)(iVar69 < auVar96._8_4_);
              auVar88._12_4_ = -(uint)(iVar45 < auVar96._12_4_);
              auVar19._4_4_ = auVar88._0_4_;
              auVar19._0_4_ = auVar88._0_4_;
              auVar19._8_4_ = auVar88._8_4_;
              auVar19._12_4_ = auVar88._8_4_;
              auVar98 = pshuflw(auVar111,auVar19,0xe8);
              auVar79._0_4_ = -(uint)(auVar96._0_4_ == iVar63);
              auVar79._4_4_ = -(uint)(auVar96._4_4_ == iVar66);
              auVar79._8_4_ = -(uint)(auVar96._8_4_ == iVar69);
              auVar79._12_4_ = -(uint)(auVar96._12_4_ == iVar45);
              auVar102._4_4_ = auVar79._4_4_;
              auVar102._0_4_ = auVar79._4_4_;
              auVar102._8_4_ = auVar79._12_4_;
              auVar102._12_4_ = auVar79._12_4_;
              auVar96 = pshuflw(auVar79,auVar102,0xe8);
              auVar103._4_4_ = auVar88._4_4_;
              auVar103._0_4_ = auVar88._4_4_;
              auVar103._8_4_ = auVar88._12_4_;
              auVar103._12_4_ = auVar88._12_4_;
              auVar77 = pshuflw(auVar88,auVar103,0xe8);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 & auVar98,(auVar77 | auVar96 & auVar98) ^ auVar9);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar50[-0x10] = 0xff;
              }
              auVar20._4_4_ = auVar88._0_4_;
              auVar20._0_4_ = auVar88._0_4_;
              auVar20._8_4_ = auVar88._8_4_;
              auVar20._12_4_ = auVar88._8_4_;
              auVar103 = auVar102 & auVar20 | auVar103;
              auVar77 = packssdw(auVar103,auVar103);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96,auVar77 ^ auVar10);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._4_2_ >> 8 & 1) != 0) {
                puVar50[-0x14] = 0xff;
              }
              auVar96 = (auVar94 | auVar34) ^ auVar114;
              auVar89._0_4_ = -(uint)(iVar63 < auVar96._0_4_);
              auVar89._4_4_ = -(uint)(iVar66 < auVar96._4_4_);
              auVar89._8_4_ = -(uint)(iVar69 < auVar96._8_4_);
              auVar89._12_4_ = -(uint)(iVar45 < auVar96._12_4_);
              auVar104._4_4_ = auVar89._0_4_;
              auVar104._0_4_ = auVar89._0_4_;
              auVar104._8_4_ = auVar89._8_4_;
              auVar104._12_4_ = auVar89._8_4_;
              iVar46 = -(uint)(auVar96._4_4_ == iVar66);
              iVar47 = -(uint)(auVar96._12_4_ == iVar45);
              auVar21._4_4_ = iVar46;
              auVar21._0_4_ = iVar46;
              auVar21._8_4_ = iVar47;
              auVar21._12_4_ = iVar47;
              auVar112._4_4_ = auVar89._4_4_;
              auVar112._0_4_ = auVar89._4_4_;
              auVar112._8_4_ = auVar89._12_4_;
              auVar112._12_4_ = auVar89._12_4_;
              auVar96 = auVar21 & auVar104 | auVar112;
              auVar96 = packssdw(auVar96,auVar96);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 ^ auVar11,auVar96 ^ auVar11);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar50[-0x18] = 0xff;
              }
              auVar96 = pshufhw(auVar96,auVar104,0x84);
              auVar22._4_4_ = iVar46;
              auVar22._0_4_ = iVar46;
              auVar22._8_4_ = iVar47;
              auVar22._12_4_ = iVar47;
              auVar98 = pshufhw(auVar89,auVar22,0x84);
              auVar77 = pshufhw(auVar96,auVar112,0x84);
              auVar80._8_4_ = 0xffffffff;
              auVar80._0_8_ = 0xffffffffffffffff;
              auVar80._12_4_ = 0xffffffff;
              auVar80 = (auVar77 | auVar98 & auVar96) ^ auVar80;
              auVar96 = packssdw(auVar80,auVar80);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._6_2_ >> 8 & 1) != 0) {
                puVar50[-0x1c] = 0xff;
              }
              auVar96 = (auVar94 | auVar33) ^ auVar114;
              auVar90._0_4_ = -(uint)(iVar63 < auVar96._0_4_);
              auVar90._4_4_ = -(uint)(iVar66 < auVar96._4_4_);
              auVar90._8_4_ = -(uint)(iVar69 < auVar96._8_4_);
              auVar90._12_4_ = -(uint)(iVar45 < auVar96._12_4_);
              auVar23._4_4_ = auVar90._0_4_;
              auVar23._0_4_ = auVar90._0_4_;
              auVar23._8_4_ = auVar90._8_4_;
              auVar23._12_4_ = auVar90._8_4_;
              auVar98 = pshuflw(auVar112,auVar23,0xe8);
              auVar81._0_4_ = -(uint)(auVar96._0_4_ == iVar63);
              auVar81._4_4_ = -(uint)(auVar96._4_4_ == iVar66);
              auVar81._8_4_ = -(uint)(auVar96._8_4_ == iVar69);
              auVar81._12_4_ = -(uint)(auVar96._12_4_ == iVar45);
              auVar105._4_4_ = auVar81._4_4_;
              auVar105._0_4_ = auVar81._4_4_;
              auVar105._8_4_ = auVar81._12_4_;
              auVar105._12_4_ = auVar81._12_4_;
              auVar96 = pshuflw(auVar81,auVar105,0xe8);
              auVar106._4_4_ = auVar90._4_4_;
              auVar106._0_4_ = auVar90._4_4_;
              auVar106._8_4_ = auVar90._12_4_;
              auVar106._12_4_ = auVar90._12_4_;
              auVar77 = pshuflw(auVar90,auVar106,0xe8);
              auVar91._8_4_ = 0xffffffff;
              auVar91._0_8_ = 0xffffffffffffffff;
              auVar91._12_4_ = 0xffffffff;
              auVar91 = (auVar77 | auVar96 & auVar98) ^ auVar91;
              auVar77 = packssdw(auVar91,auVar91);
              auVar96 = packsswb(auVar96 & auVar98,auVar77);
              if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar50[-0x20] = 0xff;
              }
              auVar24._4_4_ = auVar90._0_4_;
              auVar24._0_4_ = auVar90._0_4_;
              auVar24._8_4_ = auVar90._8_4_;
              auVar24._12_4_ = auVar90._8_4_;
              auVar106 = auVar105 & auVar24 | auVar106;
              auVar77 = packssdw(auVar106,auVar106);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar77 = packssdw(auVar77 ^ auVar12,auVar77 ^ auVar12);
              auVar96 = packsswb(auVar96,auVar77);
              if ((auVar96._8_2_ >> 8 & 1) != 0) {
                puVar50[-0x24] = 0xff;
              }
              auVar96 = (auVar94 | auVar32) ^ auVar114;
              auVar92._0_4_ = -(uint)(iVar63 < auVar96._0_4_);
              auVar92._4_4_ = -(uint)(iVar66 < auVar96._4_4_);
              auVar92._8_4_ = -(uint)(iVar69 < auVar96._8_4_);
              auVar92._12_4_ = -(uint)(iVar45 < auVar96._12_4_);
              auVar107._4_4_ = auVar92._0_4_;
              auVar107._0_4_ = auVar92._0_4_;
              auVar107._8_4_ = auVar92._8_4_;
              auVar107._12_4_ = auVar92._8_4_;
              iVar46 = -(uint)(auVar96._4_4_ == iVar66);
              iVar47 = -(uint)(auVar96._12_4_ == iVar45);
              auVar25._4_4_ = iVar46;
              auVar25._0_4_ = iVar46;
              auVar25._8_4_ = iVar47;
              auVar25._12_4_ = iVar47;
              auVar113._4_4_ = auVar92._4_4_;
              auVar113._0_4_ = auVar92._4_4_;
              auVar113._8_4_ = auVar92._12_4_;
              auVar113._12_4_ = auVar92._12_4_;
              auVar96 = auVar25 & auVar107 | auVar113;
              auVar96 = packssdw(auVar96,auVar96);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 ^ auVar13,auVar96 ^ auVar13);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar50[-0x28] = 0xff;
              }
              auVar96 = pshufhw(auVar96,auVar107,0x84);
              auVar26._4_4_ = iVar46;
              auVar26._0_4_ = iVar46;
              auVar26._8_4_ = iVar47;
              auVar26._12_4_ = iVar47;
              auVar98 = pshufhw(auVar92,auVar26,0x84);
              auVar77 = pshufhw(auVar96,auVar113,0x84);
              auVar82._8_4_ = 0xffffffff;
              auVar82._0_8_ = 0xffffffffffffffff;
              auVar82._12_4_ = 0xffffffff;
              auVar82 = (auVar77 | auVar98 & auVar96) ^ auVar82;
              auVar96 = packssdw(auVar82,auVar82);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._10_2_ >> 8 & 1) != 0) {
                puVar50[-0x2c] = 0xff;
              }
              auVar96 = (auVar94 | _DAT_0023e540) ^ auVar114;
              auVar93._0_4_ = -(uint)(iVar63 < auVar96._0_4_);
              auVar93._4_4_ = -(uint)(iVar66 < auVar96._4_4_);
              auVar93._8_4_ = -(uint)(iVar69 < auVar96._8_4_);
              auVar93._12_4_ = -(uint)(iVar45 < auVar96._12_4_);
              auVar27._4_4_ = auVar93._0_4_;
              auVar27._0_4_ = auVar93._0_4_;
              auVar27._8_4_ = auVar93._8_4_;
              auVar27._12_4_ = auVar93._8_4_;
              auVar98 = pshuflw(auVar113,auVar27,0xe8);
              auVar83._0_4_ = -(uint)(auVar96._0_4_ == iVar63);
              auVar83._4_4_ = -(uint)(auVar96._4_4_ == iVar66);
              auVar83._8_4_ = -(uint)(auVar96._8_4_ == iVar69);
              auVar83._12_4_ = -(uint)(auVar96._12_4_ == iVar45);
              auVar108._4_4_ = auVar83._4_4_;
              auVar108._0_4_ = auVar83._4_4_;
              auVar108._8_4_ = auVar83._12_4_;
              auVar108._12_4_ = auVar83._12_4_;
              auVar96 = pshuflw(auVar83,auVar108,0xe8);
              auVar109._4_4_ = auVar93._4_4_;
              auVar109._0_4_ = auVar93._4_4_;
              auVar109._8_4_ = auVar93._12_4_;
              auVar109._12_4_ = auVar93._12_4_;
              auVar77 = pshuflw(auVar93,auVar109,0xe8);
              auVar14._8_4_ = 0xffffffff;
              auVar14._0_8_ = 0xffffffffffffffff;
              auVar14._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 & auVar98,(auVar77 | auVar96 & auVar98) ^ auVar14);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar50[-0x30] = 0xff;
              }
              auVar28._4_4_ = auVar93._0_4_;
              auVar28._0_4_ = auVar93._0_4_;
              auVar28._8_4_ = auVar93._8_4_;
              auVar28._12_4_ = auVar93._8_4_;
              auVar109 = auVar108 & auVar28 | auVar109;
              auVar77 = packssdw(auVar109,auVar109);
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96,auVar77 ^ auVar15);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._12_2_ >> 8 & 1) != 0) {
                puVar50[-0x34] = 0xff;
              }
              auVar96 = (auVar94 | _DAT_0023e530) ^ auVar114;
              auVar84._0_4_ = -(uint)(iVar63 < auVar96._0_4_);
              auVar84._4_4_ = -(uint)(iVar66 < auVar96._4_4_);
              auVar84._8_4_ = -(uint)(iVar69 < auVar96._8_4_);
              auVar84._12_4_ = -(uint)(iVar45 < auVar96._12_4_);
              auVar110._4_4_ = auVar84._0_4_;
              auVar110._0_4_ = auVar84._0_4_;
              auVar110._8_4_ = auVar84._8_4_;
              auVar110._12_4_ = auVar84._8_4_;
              auVar95._4_4_ = -(uint)(auVar96._4_4_ == iVar66);
              auVar95._12_4_ = -(uint)(auVar96._12_4_ == iVar45);
              auVar95._0_4_ = auVar95._4_4_;
              auVar95._8_4_ = auVar95._12_4_;
              auVar97._4_4_ = auVar84._4_4_;
              auVar97._0_4_ = auVar84._4_4_;
              auVar97._8_4_ = auVar84._12_4_;
              auVar97._12_4_ = auVar84._12_4_;
              auVar77 = auVar95 & auVar110 | auVar97;
              auVar96 = packssdw(auVar84,auVar77);
              auVar16._8_4_ = 0xffffffff;
              auVar16._0_8_ = 0xffffffffffffffff;
              auVar16._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 ^ auVar16,auVar96 ^ auVar16);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar50[-0x38] = 0xff;
              }
              auVar96 = pshufhw(auVar96,auVar110,0x84);
              in_XMM2 = pshufhw(auVar77,auVar95,0x84);
              in_XMM2 = in_XMM2 & auVar96;
              auVar96 = pshufhw(auVar96,auVar97,0x84);
              auVar85._8_4_ = 0xffffffff;
              auVar85._0_8_ = 0xffffffffffffffff;
              auVar85._12_4_ = 0xffffffff;
              auVar85 = (auVar96 | in_XMM2) ^ auVar85;
              auVar96 = packssdw(auVar85,auVar85);
              in_XMM1 = packsswb(auVar96,auVar96);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar50[-0x3c] = 0xff;
              }
              uVar70 = uVar70 + 0x10;
              puVar50 = puVar50 + -0x40;
            } while ((uVar54 + 0x10 & 0x3ffffff0) != uVar70);
          }
          if ((int)local_88b0 < 1) {
            uVar71 = s->img_x;
          }
          else {
            uVar71 = s->img_x;
            if (0 < (int)sVar43 >> 1) {
              uVar54 = uVar71 * iVar44;
              uVar65 = (sVar43 - 1) * uVar54;
              uVar57 = 0;
              uVar70 = 0;
              do {
                if (0 < (int)uVar54) {
                  uVar49 = 0;
                  do {
                    uVar2 = data_00[uVar49 + uVar57];
                    data_00[uVar49 + uVar57] = data_00[uVar49 + uVar65];
                    data_00[uVar49 + uVar65] = uVar2;
                    uVar49 = uVar49 + 1;
                  } while (uVar54 != uVar49);
                }
                uVar70 = uVar70 + 1;
                uVar65 = uVar65 - uVar54;
                uVar57 = uVar57 + uVar54;
              } while (uVar70 != (uint)((int)sVar43 >> 1));
            }
          }
          if ((req_comp != 0) && (iVar44 != req_comp)) {
            data_00 = stbi__convert_format(data_00,iVar44,req_comp,uVar71,sVar43);
            if (data_00 == (uchar *)0x0) {
              return (void *)0x0;
            }
            uVar71 = s->img_x;
          }
          *x = uVar71;
          *y = s->img_y;
          if (comp != (int *)0x0) {
            *comp = s->img_n;
            return data_00;
          }
          return data_00;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
LAB_00195d92:
        iVar44 = stbi__gif_test(s);
        if (iVar44 == 0) {
          sVar43 = stbi__get32be(s);
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if (sVar43 == 0x38425053) {
            pvVar51 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
            return pvVar51;
          }
          iVar44 = stbi__pic_test(s);
          if (iVar44 != 0) {
            pvVar51 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
            return pvVar51;
          }
          iVar44 = stbi__pnm_test(s);
          if (iVar44 != 0) {
            pvVar51 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
            return pvVar51;
          }
          iVar44 = stbi__hdr_test(s);
          if (iVar44 == 0) {
            iVar44 = stbi__tga_test(s);
            if (iVar44 == 0) {
              stbi__g_failure_reason = "unknown image type";
              return (void *)0x0;
            }
            pvVar51 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
            return pvVar51;
          }
          data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
          if (req_comp == 0) {
            req_comp = *comp;
          }
          psVar60 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
          return psVar60;
        }
        memset(&local_88a8,0,0x8870);
        psVar53 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar60);
        if (psVar53 == (stbi__context *)0x0 || psVar53 == s) {
          if ((stbi__jpeg *)local_88a8.out != (stbi__jpeg *)0x0) {
            free(local_88a8.out);
          }
          psVar53 = (stbi__context *)0x0;
        }
        else {
          *x = local_88a8.w;
          *y = local_88a8.h;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar53 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar53,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar48 = (stbi__jpeg *)local_88a8.background;
        goto LAB_001963d0;
      }
      lVar59 = lVar59 + 1;
    } while (lVar59 != 8);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    local_88a8._0_8_ = s;
    iVar44 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
    uVar7 = local_88a8._0_8_;
    if (iVar44 == 0) {
      psVar53 = (stbi__context *)0x0;
    }
    else {
      iVar44 = 8;
      if (8 < local_88a8.flags) {
        iVar44 = local_88a8.flags;
      }
      ri->bits_per_channel = iVar44;
      psVar53 = (stbi__context *)local_88a8.history;
      if ((req_comp != 0) && (iVar44 = *(int *)(local_88a8._0_8_ + 0xc), iVar44 != req_comp)) {
        if (local_88a8.flags < 9) {
          psVar53 = (stbi__context *)
                    stbi__convert_format
                              (local_88a8.history,iVar44,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                               *(stbi__uint32 *)(local_88a8._0_8_ + 4));
        }
        else {
          psVar53 = (stbi__context *)
                    stbi__convert_format16
                              ((stbi__uint16 *)local_88a8.history,iVar44,req_comp,
                               *(stbi__uint32 *)local_88a8._0_8_,
                               *(stbi__uint32 *)(local_88a8._0_8_ + 4));
        }
        *(int *)(uVar7 + 0xc) = req_comp;
        if (psVar53 == (stbi__context *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(stbi__uint32 *)uVar7;
      *y = *(stbi__uint32 *)(uVar7 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar7 + 8);
      }
      local_88a8.history = (stbi_uc *)0x0;
    }
    free(local_88a8.history);
    free(local_88a8.background);
    psVar48 = (stbi__jpeg *)local_88a8.out;
  }
LAB_001963d0:
  free(psVar48);
  return psVar53;
LAB_00195d00:
  bVar75 = false;
LAB_00195d02:
  if (!bVar75) goto LAB_001963b6;
LAB_00195d0a:
  bVar38 = psVar48->marker;
LAB_00195d15:
  if (bVar38 == 0xff) {
    do {
      psVar53 = psVar48->s;
      if ((psVar53->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00195d41:
        if (psVar53->img_buffer_end <= psVar53->img_buffer) goto LAB_00194fe7;
      }
      else {
        iVar44 = (*(psVar53->io).eof)(psVar53->io_user_data);
        if (iVar44 != 0) {
          if (psVar53->read_from_callbacks != 0) goto LAB_00195d41;
          goto LAB_00194fe7;
        }
      }
      sVar37 = stbi__get8(psVar48->s);
    } while (sVar37 != 0xff);
    sVar37 = stbi__get8(psVar48->s);
    psVar48->marker = sVar37;
  }
LAB_00194fe7:
  bVar38 = stbi__get_marker(psVar48);
  goto LAB_00194f5e;
LAB_0019694a:
  stbi__g_failure_reason = "bad huffman code";
LAB_001963af:
  uVar71 = (uint)paVar58;
  goto LAB_001963b6;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}